

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O1

Complex __thiscall libDAI::TRW::logZ(TRW *this)

{
  _Base_ptr p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  double *pdVar6;
  undefined4 extraout_var_04;
  Var *pVVar7;
  undefined4 extraout_var_05;
  long *plVar8;
  undefined4 extraout_var_06;
  const_iterator cVar9;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  long lVar10;
  size_t I;
  Var *pVVar11;
  Var *i;
  double dVar12;
  pointer pVVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Var v_i;
  Var v_j;
  double local_120;
  TFactor<double> local_110;
  Var *local_d8;
  WeightedGraph<double> *local_d0;
  Real local_c8;
  Factor local_c0;
  TFactor<double> local_88;
  Var local_48;
  
  iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  lVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x48))
                    ((long *)CONCAT44(extraout_var,iVar3));
  if (lVar4 == 0) {
    local_120 = 0.0;
  }
  else {
    local_120 = 0.0;
    I = 0;
    do {
      beliefF(&local_c0,this,I);
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      dVar12 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x50))
                                 ((long *)CONCAT44(extraout_var_00,iVar3),I);
      TFactor<double>::log(&local_88,dVar12);
      TFactor<double>::operator*(&local_110,&local_c0,&local_88);
      if ((long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        dVar12 = 0.0;
      }
      else {
        lVar4 = (long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3;
        dVar12 = 0.0;
        lVar10 = 0;
        do {
          dVar12 = dVar12 + local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar10];
          lVar10 = lVar10 + 1;
        } while (lVar4 + (ulong)(lVar4 == 0) != lVar10);
      }
      if (local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (Var *)0x0) {
        operator_delete(local_110._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_110._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_88._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_88._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_88._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_88._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_c0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_120 = local_120 + dVar12;
      I = I + 1;
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x48))
                        ((long *)CONCAT44(extraout_var_01,iVar3));
    } while (I < uVar5);
  }
  iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
  auVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x28))
                      ((long *)CONCAT44(extraout_var_02,iVar3));
  if (auVar16._0_8_ != 0) {
    local_d0 = &this->_rho_e;
    i = (Var *)0x0;
    do {
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      pdVar6 = (double *)
               (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x30))
                         ((long *)CONCAT44(extraout_var_03,iVar3),i);
      pVVar13 = (pointer)*pdVar6;
      local_88._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)pdVar6[1];
      local_88._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start = pVVar13;
      beliefV(&local_110,this,(size_t)i);
      TProb<double>::entropy(&local_110._p);
      if (local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (Var *)0x0) {
        operator_delete(local_110._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_110._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_110._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_120 = local_120 + (double)pVVar13;
      pVVar11 = (Var *)((long)&i->_label + 1);
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      pVVar7 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x28))
                                ((long *)CONCAT44(extraout_var_04,iVar3));
      local_d8 = pVVar11;
      if (pVVar11 < pVVar7) {
        do {
          iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                            (this);
          plVar8 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar3) + 0x30))
                                     ((long *)CONCAT44(extraout_var_05,iVar3),pVVar11);
          local_48._label = *plVar8;
          local_48._states = plVar8[1];
          iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                            (this);
          (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar3) + 0x70))
                    (&local_110,(long *)CONCAT44(extraout_var_06,iVar3),&local_88);
          bVar2 = std::
                  binary_search<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,libDAI::Var>
                            ((__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                              )local_110._vs._vars.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_start,
                             (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                              )local_110._vs._vars.
                               super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl
                               .super__Vector_impl_data._M_finish,&local_48);
          if (local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
              _M_impl.super__Vector_impl_data._M_start != (Var *)0x0) {
            operator_delete(local_110._vs._vars.
                            super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_110._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_110._vs._vars.
                                  super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (bVar2) {
            local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_start = i;
            local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
            _M_impl.super__Vector_impl_data._M_finish = pVVar11;
            cVar9 = std::
                    _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                    ::find((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
                            *)local_d0,(key_type *)&local_110);
            p_Var1 = cVar9._M_node[1]._M_left;
            VarSet::VarSet(&local_c0._vs,(Var *)&local_88,&local_48);
            (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0xb])
                      (&local_110,this,&local_c0);
            local_c8 = MutualInfo<double>(&local_110);
            if (local_110._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_110._p._p.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_110._p._p.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            if (local_110._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                _M_impl.super__Vector_impl_data._M_start != (Var *)0x0) {
              operator_delete(local_110._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_110._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_110._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_c0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_c0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_c0._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c0._vs._vars.
                                    super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            auVar14._8_8_ = 0;
            auVar14._0_8_ = local_120;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = local_c8;
            auVar16._8_8_ = 0;
            auVar16._0_8_ = p_Var1;
            auVar16 = vfnmadd231sd_fma(auVar14,auVar15,auVar16);
            local_120 = auVar16._0_8_;
          }
          pVVar11 = (Var *)((long)&pVVar11->_label + 1);
          iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])
                            (this);
          pVVar7 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar3) + 0x28))
                                    ((long *)CONCAT44(extraout_var_07,iVar3));
        } while (pVVar11 < pVVar7);
      }
      iVar3 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])(this);
      auVar16 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar3) + 0x28))
                          ((long *)CONCAT44(extraout_var_08,iVar3));
      i = local_d8;
    } while (local_d8 < auVar16._0_8_);
  }
  return (Complex)(_ComplexT)auVar16;
}

Assistant:

Complex TRW::logZ() const {
/*        Complex sum = 0.0;
        for(size_t i = 0; i < grm().nrVars(); i++ )
            sum += Complex(1.0 - grm().nbV(i).size()) * beliefV(i).entropy();
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum -= KL_dist( beliefF(I), grm().factor(I) );
        return sum;*/

        Real sum = 0.0;
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            sum += (beliefF(I) * grm().factor(I).log()).totalSum();
        for( size_t i = 0; i < grm().nrVars(); i++ ) {
            Var v_i = grm().var(i);
            sum += real(beliefV(i).entropy());
            for( size_t j = i+1; j < grm().nrVars(); j++ ) {
                Var v_j = grm().var(j);
                if( grm().delta(v_i) && v_j )
                    sum -= rho(i,j) * MutualInfo( belief( v_i | v_j ) );
            }
        }
        return sum;
    }